

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.cc
# Opt level: O1

string * google::protobuf::TestSourceDir_abi_cxx11_(void)

{
  bool bVar1;
  char *__s;
  string *in_RDI;
  string local_b0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  __s = getenv("srcdir");
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if (__s == (char *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>();
    while( true ) {
      local_90.piece_._M_str = (in_RDI->_M_dataplus)._M_p;
      local_90.piece_._M_len = in_RDI->_M_string_length;
      local_60.piece_._M_len = 0x22;
      local_60.piece_._M_str = "/src/google/protobuf/descriptor.cc";
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_b0,(lts_20250127 *)&local_90,&local_60,(AlphaNum *)local_90.piece_._M_len);
      bVar1 = File::Exists(&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (bVar1) break;
      bVar1 = File::Exists(in_RDI);
      if (!bVar1) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_90,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/googletest.cc"
                   ,0x53);
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  ((LogMessage *)&local_90,
                   (char (*) [106])
                   "Could not find protobuf source code.  Please run tests from somewhere within the protobuf source package."
                  );
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_90);
      }
      local_90.piece_._M_len = 3;
      local_90.piece_._M_str = "/..";
      absl::lts_20250127::StrAppend(in_RDI,&local_90);
    }
    local_90.piece_._M_len = 4;
    local_90.piece_._M_str = "/src";
    absl::lts_20250127::StrAppend(in_RDI,&local_90);
  }
  else {
    strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>();
  }
  return in_RDI;
}

Assistant:

std::string TestSourceDir() {
#ifndef GOOGLE_THIRD_PARTY_PROTOBUF
#ifdef GOOGLE_PROTOBUF_TEST_SOURCE_PATH
  return GOOGLE_PROTOBUF_TEST_SOURCE_PATH;
#else
#ifndef _MSC_VER
  // automake sets the "srcdir" environment variable.
  char* result = getenv("srcdir");
  if (result != nullptr) {
    return result;
  }
#endif  // _MSC_VER

  // Look for the "src" directory.
  std::string prefix = ".";

  // Keep looking further up the directory tree until we find
  // src/.../descriptor.cc. It is important to look for a particular file,
  // keeping in mind that with Bazel builds the directory structure under
  // bazel-bin/ looks similar to the main directory tree in the Git repo.
  while (!File::Exists(
      absl::StrCat(prefix, "/src/google/protobuf/descriptor.cc"))) {
    if (!File::Exists(prefix)) {
      ABSL_LOG(FATAL)
          << "Could not find protobuf source code.  Please run tests from "
             "somewhere within the protobuf source package.";
    }
    absl::StrAppend(&prefix, "/..");
  }
  absl::StrAppend(&prefix, "/src");
  return prefix;
#endif  // GOOGLE_PROTOBUF_TEST_SOURCE_PATH
#else
  return "third_party/protobuf/src";
#endif  // GOOGLE_THIRD_PARTY_PROTOBUF
}